

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_wrapper.hxx
# Opt level: O3

void __thiscall logger_wrapper::logger_wrapper(logger_wrapper *this,string *log_file,int log_level)

{
  SimpleLogger *this_00;
  string local_40;
  
  (this->super_logger)._vptr_logger = (_func_int **)&PTR__logger_wrapper_005c2bc8;
  this_00 = (SimpleLogger *)operator_new(0x2c8);
  SimpleLogger::SimpleLogger(this_00,log_file,0x400,0x2000000,10);
  this->my_log_ = this_00;
  SimpleLogger::setLogLevel(this_00,log_level);
  SimpleLogger::setDispLevel(this->my_log_,-1);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"./","");
  SimpleLogger::setCrashDumpPath(&local_40,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  SimpleLogger::start(this->my_log_);
  return;
}

Assistant:

logger_wrapper(const std::string& log_file, int log_level = 6) {
        my_log_ = new SimpleLogger(log_file, 1024, 32*1024*1024, 10);
        my_log_->setLogLevel(log_level);
        my_log_->setDispLevel(-1);
        my_log_->setCrashDumpPath("./", true);
        my_log_->start();
    }